

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsStore::Run(BasicAllTargetsStore *this)

{
  bool bVar1;
  Vector<unsigned_int,_4> local_13c;
  Vector<unsigned_int,_4> local_12c;
  Vector<int,_4> local_11c;
  Vector<int,_4> local_10c;
  int local_fc;
  GLint isamples;
  Vector<float,_4> local_e8;
  Vector<unsigned_int,_4> local_d8;
  Vector<unsigned_int,_4> local_c8;
  Vector<int,_4> local_b8;
  Vector<int,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<unsigned_int,_4> local_78;
  Vector<unsigned_int,_4> local_68;
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  BasicAllTargetsStore *local_18;
  BasicAllTargetsStore *this_local;
  
  local_18 = this;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  tcu::Vector<float,_4>::Vector(&local_28,-1.0,2.0,3.0,-4.0);
  tcu::Vector<float,_4>::Vector(&local_38,-1.0,2.0,3.0,-4.0);
  bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<float,4>>
                    ((BasicAllTargetsStore *)this,0x8814,&local_28,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<int,_4>::Vector(&local_48,1,-2,3,-4);
    tcu::Vector<int,_4>::Vector(&local_58,1,-2,3,-4);
    bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<int,4>>
                      ((BasicAllTargetsStore *)this,0x8d82,&local_48,&local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_4>::Vector(&local_68,1,2,3,4);
      tcu::Vector<unsigned_int,_4>::Vector(&local_78,1,2,3,4);
      bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
              Write<tcu::Vector<unsigned_int,4>>
                        ((BasicAllTargetsStore *)this,0x8d70,&local_68,&local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<float,_4>::Vector(&local_88,-1.0,2.0,3.0,-4.0);
        tcu::Vector<float,_4>::Vector(&local_98,-1.0,2.0,3.0,-4.0);
        bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                WriteCubeArray<tcu::Vector<float,4>>
                          ((BasicAllTargetsStore *)this,0x8814,&local_88,&local_98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<int,_4>::Vector(&local_a8,1,-2,3,-4);
          tcu::Vector<int,_4>::Vector(&local_b8,1,-2,3,-4);
          bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                  WriteCubeArray<tcu::Vector<int,4>>
                            ((BasicAllTargetsStore *)this,0x8d82,&local_a8,&local_b8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<unsigned_int,_4>::Vector(&local_c8,1,2,3,4);
            tcu::Vector<unsigned_int,_4>::Vector(&local_d8,1,2,3,4);
            bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                    WriteCubeArray<tcu::Vector<unsigned_int,4>>
                              ((BasicAllTargetsStore *)this,0x8d70,&local_c8,&local_d8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              bVar1 = ShaderImageLoadStoreBase::SupportedSamples
                                (&this->super_ShaderImageLoadStoreBase,4);
              if (bVar1) {
                tcu::Vector<float,_4>::Vector(&local_e8,-1.0,2.0,3.0,-4.0);
                tcu::Vector<float,_4>::Vector
                          ((Vector<float,_4> *)&stack0xffffffffffffff08,-1.0,2.0,3.0,-4.0);
                bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                        WriteMS<tcu::Vector<float,4>>
                                  ((BasicAllTargetsStore *)this,0x8814,&local_e8,
                                   (Vector<float,_4> *)&stack0xffffffffffffff08);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
                  return (long)this_local;
                }
                glu::CallLogWrapper::glGetIntegerv
                          (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper
                            .super_CallLogWrapper,0x9110,&local_fc);
                if (3 < local_fc) {
                  tcu::Vector<int,_4>::Vector(&local_10c,1,-2,3,-4);
                  tcu::Vector<int,_4>::Vector(&local_11c,1,-2,3,-4);
                  bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                          WriteMS<tcu::Vector<int,4>>
                                    ((BasicAllTargetsStore *)this,0x8d82,&local_10c,&local_11c);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
                    return (long)this_local;
                  }
                  tcu::Vector<unsigned_int,_4>::Vector(&local_12c,1,2,3,4);
                  tcu::Vector<unsigned_int,_4>::Vector(&local_13c,1,2,3,4);
                  bVar1 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                          WriteMS<tcu::Vector<unsigned_int,4>>
                                    ((BasicAllTargetsStore *)this,0x8d70,&local_12c,&local_13c);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
                    return (long)this_local;
                  }
                }
              }
              this_local = (BasicAllTargetsStore *)0x0;
            }
            else {
              this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAllTargetsStore *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Write(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		if (!WriteCubeArray(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!WriteCubeArray(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!WriteCubeArray(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		if (SupportedSamples(4))
		{
			if (!WriteMS(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
				return ERROR;

			GLint isamples;
			glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
			if (isamples >= 4)
			{
				if (!WriteMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
					return ERROR;
				if (!WriteMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
					return ERROR;
			}
		}
		return NO_ERROR;
	}